

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.h
# Opt level: O0

void __thiscall
ExprHash::Init(ExprHash *this,OpCode opcode,ValueNumber src1Val,ValueNumber src2Val,
              ExprAttributes exprAttributes)

{
  byte bVar1;
  ExprHash EVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  uint32 opCodeHash;
  ValueNumber src2Val_local;
  ValueNumber src1Val_local;
  OpCode opcode_local;
  ExprHash *this_local;
  ExprAttributes exprAttributes_local;
  
  bVar1 = OpCodeToHash[(int)(uint)opcode];
  *this = (ExprHash)((uint)*this & 0xffffff00 | (uint)bVar1);
  *this = (ExprHash)((uint)*this & 0xfff800ff | (src1Val & 0x7ff) << 8);
  *this = (ExprHash)((uint)*this & 0xc007ffff | (src2Val & 0x7ff) << 0x13);
  this_local._4_4_ = exprAttributes.attributes;
  uVar5 = ExprAttributes::Attributes((ExprAttributes *)((long)&this_local + 4));
  *this = (ExprHash)((uint)*this & 0x3fffffff | uVar5 << 0x1e);
  if (((uint)*this & 0xff) != (uint)bVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.h"
                       ,0x3b,"(this->opcode == (uint32)opCodeHash)",
                       "Opcode value too large for CSEs");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  EVar2 = *this;
  uVar5 = ExprAttributes::Attributes((ExprAttributes *)((long)&this_local + 4));
  if ((uint)EVar2 >> 0x1e != uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.h"
                       ,0x3c,"(this->attributes == exprAttributes.Attributes())",
                       "Not enough bits for expr attributes");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((((uint)*this >> 8 & 0x7ff) != src1Val) || (((uint)*this >> 0x13 & 0x7ff) != src2Val)) {
    *this = (ExprHash)((uint)*this & 0xffffff00);
    *this = (ExprHash)((uint)*this & 0xfff800ff);
    *this = (ExprHash)((uint)*this & 0xc007ffff);
    *this = (ExprHash)((uint)*this & 0x3fffffff);
  }
  return;
}

Assistant:

void Init(Js::OpCode opcode, ValueNumber src1Val, ValueNumber src2Val, ExprAttributes exprAttributes)
    {
        extern uint8 OpCodeToHash[(int)Js::OpCode::Count];

        uint32 opCodeHash = OpCodeToHash[(int)opcode];
        this->opcode = opCodeHash;
        this->src1Val = src1Val;
        this->src2Val = src2Val;
        this->attributes = exprAttributes.Attributes();

        // Assert too many opcodes...
        AssertMsg(this->opcode == (uint32)opCodeHash, "Opcode value too large for CSEs");
        AssertMsg(this->attributes == exprAttributes.Attributes(), "Not enough bits for expr attributes");

        // If value numbers are too large, just give up
        if (this->src1Val != src1Val || this->src2Val != src2Val)
        {
            this->opcode = 0;
            this->src1Val = 0;
            this->src2Val = 0;
            this->attributes = 0;
        }
    }